

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

bool MeCab::FeatureIndex::compile(Param *param,char *txtfile,char *binfile)

{
  ostream *poVar1;
  size_t sVar2;
  string buf;
  ofstream ofs;
  die local_239;
  string local_238;
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  convert(param,txtfile,&local_238);
  std::ofstream::ofstream(&local_218,binfile,_S_out|_S_bin);
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x215);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ofs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"permission denied: ",0x13);
    if (binfile == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar2 = strlen(binfile);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,binfile,sVar2);
    }
    die::~die(&local_239);
  }
  std::ostream::write((char *)&local_218,(long)local_238._M_dataplus._M_p);
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool FeatureIndex::compile(const Param &param,
                           const char* txtfile, const char *binfile) {
  std::string buf;
  FeatureIndex::convert(param, txtfile, &buf);
  std::ofstream ofs(WPATH(binfile), std::ios::binary|std::ios::out);
  CHECK_DIE(ofs) << "permission denied: " << binfile;
  ofs.write(buf.data(), buf.size());
  return true;
}